

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

Elem * new_string(Grammar *g,char *s,char *e,Rule *r)

{
  Elem *pEVar1;
  Elem *x;
  Rule *r_local;
  char *e_local;
  char *s_local;
  Grammar *g_local;
  
  pEVar1 = new_term_string(g,s + 1,e + -1,r);
  *(uint *)&((pEVar1->e).nterm)->name = (uint)(*s == '\"');
  unescape_term_string((pEVar1->e).term);
  return pEVar1;
}

Assistant:

Elem *new_string(Grammar *g, char *s, char *e, Rule *r) {
  Elem *x = new_term_string(g, s + 1, e - 1, r);
  x->e.term->kind = (*s == '"') ? TERM_REGEX : TERM_STRING;
  unescape_term_string(x->e.term);
  return x;
}